

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::BpTree(BpTree<int> *this,string *IndexFileName)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int n;
  value_type_conflict1 local_54;
  string local_50;
  
  (this->Index_FileName)._M_dataplus._M_p = (pointer)&(this->Index_FileName).field_2;
  (this->Index_FileName)._M_string_length = 0;
  (this->Index_FileName).field_2._M_local_buf[0] = '\0';
  (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->Index_FileName);
  std::__cxx11::string::string((string *)&local_50,(string *)IndexFileName);
  lVar3 = 0;
  iVar1 = Buffer::Allocate(&blocks,&local_50,0);
  std::__cxx11::string::~string((string *)&local_50);
  lVar2 = (long)iVar1;
  this->Data_Type = blocks.buffer[lVar2].data[0];
  this->N = *(int *)(blocks.buffer[lVar2].data + 1);
  (this->RootAddr).FileOff = *(int *)(blocks.buffer[lVar2].data + 5);
  this->Current_Off = *(int *)(blocks.buffer[lVar2].data + 9);
  iVar1 = *(int *)(blocks.buffer[lVar2].data + 0xd);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != (int)lVar3; lVar3 = lVar3 + 1) {
    local_54 = *(value_type_conflict1 *)(lVar2 * 0x2028 + 0x1543ad + lVar3 * 4);
    std::vector<int,_std::allocator<int>_>::push_back(&this->FileOff_bin,&local_54);
  }
  return;
}

Assistant:

BpTree<K>::BpTree(string IndexFileName) {
	int i, s, n;
	this->Index_FileName = IndexFileName;
	int BlockNum = blocks.Allocate(IndexFileName, 0);
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&this->Data_Type, p, sizeof(char));
	p += sizeof(char);
	memcpy(&this->N, p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&this->RootAddr.FileOff), p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&this->Current_Off), p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&s), p, sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s; i++) {
		memcpy(reinterpret_cast<char*>(&n), p, sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.push_back(n);
	}
}